

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,char *obj,cmFortranSourceInfo *info,string *mod_dir,
          char *stamp_dir,ostream *makeDepends,ostream *internalDepends)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmLocalGenerator *pcVar3;
  cmMakefile *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  bool bVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  _Rb_tree_node_base *p_Var9;
  const_iterator cVar10;
  iterator iVar11;
  iterator iVar12;
  _Base_ptr p_Var13;
  char *pcVar14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *path;
  char *path_00;
  char *path_01;
  char *path_02;
  char *path_03;
  char *path_04;
  cmDependsFortranInternals *pcVar15;
  string stampFile_1;
  string modFile;
  string obj_m;
  string binDir;
  string obj_i;
  string local_158;
  ostream *local_138;
  string local_130;
  string local_110;
  string local_f0;
  cmFortranSourceInfo *local_d0;
  _Base_ptr local_c8;
  string local_c0;
  char *local_a0;
  string local_98;
  string local_78;
  string *local_58;
  string local_50;
  
  pcVar14 = (info->Source)._M_dataplus._M_p;
  local_138 = makeDepends;
  local_d0 = info;
  local_a0 = stamp_dir;
  local_58 = mod_dir;
  pcVar6 = cmLocalGenerator::GetBinaryDirectory((this->super_cmDepends).LocalGenerator);
  std::__cxx11::string::string((string *)&local_98,pcVar6,(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_f0,obj,(allocator *)&local_158);
  MaybeConvertToRelativePath(&local_78,this,&local_98,&local_f0);
  pcVar6 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    pcVar6 = extraout_RDX_00;
  }
  cmSystemTools::ConvertToOutputPath_abi_cxx11_
            (&local_f0,(cmSystemTools *)local_78._M_dataplus._M_p,pcVar6);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (internalDepends,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(internalDepends," ",1);
  if (pcVar14 == (char *)0x0) {
    std::ios::clear((int)internalDepends + (int)internalDepends->_vptr_basic_ostream[-3]);
  }
  else {
    sVar8 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>(internalDepends,pcVar14,sVar8);
  }
  std::ios::widen((char)internalDepends->_vptr_basic_ostream[-3] + (char)internalDepends);
  std::ostream::put((char)internalDepends);
  std::ostream::flush();
  psVar4 = &local_d0->Includes;
  for (p_Var9 = (local_d0->Includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_138,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    MaybeConvertToRelativePath(&local_110,this,&local_98,(string *)(p_Var9 + 1));
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&local_158,(cmSystemTools *)local_110._M_dataplus._M_p,path);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(internalDepends," ",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (internalDepends,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  std::ios::widen((char)local_138->_vptr_basic_ostream[-3] + (char)local_138);
  std::ostream::put((char)local_138);
  std::ostream::flush();
  p_Var13 = (local_d0->Requires)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_d0->Requires)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var13 != p_Var1) {
    psVar4 = &local_d0->Provides;
    local_c8 = &(local_d0->Provides)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      p_Var9 = p_Var13 + 1;
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&psVar4->_M_t,(key_type *)p_Var9);
      if (cVar10._M_node == local_c8) {
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this->Internal,(key_type *)p_Var9);
        pcVar15 = this->Internal;
        if ((_Rb_tree_header *)iVar11._M_node !=
            &(pcVar15->TargetProvides)._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::string::string((string *)&local_158,local_a0,(allocator *)&local_110);
          std::__cxx11::string::append((char *)&local_158);
          std::__cxx11::string::_M_append((char *)&local_158,*(ulong *)(p_Var13 + 1));
          std::__cxx11::string::append((char *)&local_158);
          MaybeConvertToRelativePath(&local_130,this,&local_98,&local_158);
          cmSystemTools::ConvertToOutputPath_abi_cxx11_
                    (&local_110,(cmSystemTools *)local_130._M_dataplus._M_p,path_00);
          std::__cxx11::string::operator=((string *)&local_158,(string *)&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_138,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,".requires: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,
                            CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                     local_158.field_2._M_local_buf[0]) + 1);
          }
          pcVar15 = this->Internal;
        }
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&(pcVar15->TargetRequires)._M_t,(key_type *)p_Var9);
        if ((_Rb_tree_header *)iVar12._M_node ==
            &(this->Internal->TargetRequires)._M_t._M_impl.super__Rb_tree_header) {
          abort();
        }
        if (iVar12._M_node[2]._M_parent == (_Base_ptr)0x0) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          local_158._M_string_length = 0;
          local_158.field_2._M_local_buf[0] = '\0';
          bVar5 = FindModule(this,(string *)p_Var9,&local_158);
          if (bVar5) {
            MaybeConvertToRelativePath(&local_130,this,&local_98,&local_158);
            cmSystemTools::ConvertToOutputPath_abi_cxx11_
                      (&local_110,(cmSystemTools *)local_130._M_dataplus._M_p,path_02);
            std::__cxx11::string::operator=((string *)&local_158,(string *)&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_138,local_f0._M_dataplus._M_p,local_f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          }
        }
        else {
          MaybeConvertToRelativePath(&local_110,this,&local_98,(string *)(iVar12._M_node + 2));
          cmSystemTools::ConvertToOutputPath_abi_cxx11_
                    (&local_158,(cmSystemTools *)local_110._M_dataplus._M_p,path_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_138,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var1);
  }
  p_Var13 = (local_d0->Provides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8 = &(local_d0->Provides)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var13 != local_c8) {
    do {
      std::__cxx11::string::string((string *)&local_158,local_a0,(allocator *)&local_110);
      std::__cxx11::string::append((char *)&local_158);
      std::__cxx11::string::_M_append((char *)&local_158,*(ulong *)(p_Var13 + 1));
      std::__cxx11::string::append((char *)&local_158);
      MaybeConvertToRelativePath(&local_130,this,&local_98,&local_158);
      cmSystemTools::ConvertToOutputPath_abi_cxx11_
                (&local_110,(cmSystemTools *)local_130._M_dataplus._M_p,path_03);
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_138,local_158._M_dataplus._M_p,local_158._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".provides",9);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != local_c8);
  }
  if ((local_d0->Provides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_138,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".provides.build:\n",0x11);
    p_Var13 = (local_d0->Provides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var13 != local_c8) {
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this->Internal,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var13 + 1));
        cmsys::SystemTools::LowerCase(&local_158,(string *)(p_Var13 + 1));
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        pcVar2 = (local_58->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar2,pcVar2 + local_58->_M_string_length);
        std::__cxx11::string::append((char *)&local_110);
        std::__cxx11::string::_M_append((char *)&local_110,*(ulong *)(p_Var13 + 1));
        pcVar3 = (this->super_cmDepends).LocalGenerator;
        MaybeConvertToRelativePath(&local_c0,this,&local_98,&local_110);
        cmOutputConverter::ConvertToOutputFormat
                  (&local_130,&pcVar3->super_cmOutputConverter,&local_c0,SHELL);
        std::__cxx11::string::operator=((string *)&local_110,(string *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string((string *)&local_130,local_a0,(allocator *)&local_c0);
        std::__cxx11::string::append((char *)&local_130);
        std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_158._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_130);
        pcVar3 = (this->super_cmDepends).LocalGenerator;
        MaybeConvertToRelativePath(&local_50,this,&local_98,&local_130);
        cmOutputConverter::ConvertToOutputFormat
                  (&local_c0,&pcVar3->super_cmOutputConverter,&local_50,SHELL);
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_138,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ",0x28);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_138,local_110._M_dataplus._M_p,local_110._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
        this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"CMAKE_Fortran_COMPILER_ID","");
        pcVar14 = cmMakefile::GetDefinition(this_00,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
          std::__ostream_insert<char,std::char_traits<char>>(local_138," ",1);
          sVar8 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(local_138,pcVar14,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_138,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != local_c8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (local_138,"\t$(CMAKE_COMMAND) -E touch ",0x1b);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_138,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".provides.build\n",0x10);
    pcVar2 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar2,
               pcVar2 + (this->super_cmDepends).TargetDirectory._M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    MaybeConvertToRelativePath(&local_130,this,&local_98,&local_158);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&local_110,(cmSystemTools *)local_130._M_dataplus._M_p,path_04);
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_138,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".provides.build\n",0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(const char* obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             const char* stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends)
{
  typedef cmDependsFortranInternals::TargetRequiresMap TargetRequiresMap;

  // Get the source file for this object.
  const char* src = info.Source.c_str();

  // Write the include dependencies to the output stream.
  std::string binDir = this->LocalGenerator->GetBinaryDirectory();
  std::string obj_i = this->MaybeConvertToRelativePath(binDir, obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i.c_str());
  internalDepends << obj_i << std::endl;
  internalDepends << " " << src << std::endl;
  for (std::set<std::string>::const_iterator i = info.Includes.begin();
       i != info.Includes.end(); ++i) {
    makeDepends << obj_m << ": "
                << cmSystemTools::ConvertToOutputPath(
                     this->MaybeConvertToRelativePath(binDir, *i).c_str())
                << std::endl;
    internalDepends << " " << *i << std::endl;
  }
  makeDepends << std::endl;

  // Write module requirements to the output stream.
  for (std::set<std::string>::const_iterator i = info.Requires.begin();
       i != info.Requires.end(); ++i) {
    // Require only modules not provided in the same source.
    if (std::set<std::string>::const_iterator(info.Provides.find(*i)) !=
        info.Provides.end()) {
      continue;
    }

    // If the module is provided in this target special handling is
    // needed.
    if (this->Internal->TargetProvides.find(*i) !=
        this->Internal->TargetProvides.end()) {
      // The module is provided by a different source in the same
      // target.  Add the proxy dependency to make sure the other
      // source builds first.
      std::string proxy = stamp_dir;
      proxy += "/";
      proxy += *i;
      proxy += ".mod.proxy";
      proxy = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, proxy).c_str());

      // since we require some things add them to our list of requirements
      makeDepends << obj_m << ".requires: " << proxy << std::endl;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    TargetRequiresMap::const_iterator required =
      this->Internal->TargetRequires.find(*i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, required->second).c_str());
      makeDepends << obj_m << ": " << stampFile << "\n";
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(*i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->MaybeConvertToRelativePath(binDir, module).c_str());
        makeDepends << obj_m << ": " << module << "\n";
      }
    }
  }

  // Write provided modules to the output stream.
  for (std::set<std::string>::const_iterator i = info.Provides.begin();
       i != info.Provides.end(); ++i) {
    std::string proxy = stamp_dir;
    proxy += "/";
    proxy += *i;
    proxy += ".mod.proxy";
    proxy = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, proxy).c_str());
    makeDepends << proxy << ": " << obj_m << ".provides" << std::endl;
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    makeDepends << obj_m << ".provides.build:\n";
    for (std::set<std::string>::const_iterator i = info.Provides.begin();
         i != info.Provides.end(); ++i) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(*i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string m = cmSystemTools::LowerCase(*i);
      std::string modFile = mod_dir;
      modFile += "/";
      modFile += *i;
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = stamp_dir;
      stampFile += "/";
      stampFile += m;
      stampFile += ".mod.stamp";
      stampFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, stampFile),
        cmOutputConverter::SHELL);
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << " " << stampFile;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      const char* cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cid && *cid) {
        makeDepends << " " << cid;
      }
      makeDepends << "\n";
    }
    // After copying the modules update the timestamp file so that
    // copying will not be done again until the source rebuilds.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = this->TargetDirectory;
    driver += "/build";
    driver = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, driver).c_str());
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}